

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

void prepareWriteRGB(vector<unsigned_char,_std::allocator<unsigned_char>_> *output,Image *image)

{
  uint8_t uVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  Color *__src;
  uchar *__dest;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  int *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  int i;
  uint8_t *start;
  int scanline;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe0;
  
  std::vector<Color,_std::allocator<Color>_>::size
            ((vector<Color,_std::allocator<Color>_> *)(in_RSI + 2));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffffe0,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
            );
  iVar3 = *in_RSI;
  iVar4 = iVar3 * 4;
  __src = std::vector<Color,_std::allocator<Color>_>::data
                    ((vector<Color,_std::allocator<Color>_> *)0x109085);
  __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x109094);
  memcpy(__dest,__src,(long)iVar4);
  while( true ) {
    uVar5 = (ulong)iVar4;
    sVar6 = std::vector<Color,_std::allocator<Color>_>::size
                      ((vector<Color,_std::allocator<Color>_> *)(in_RSI + 2));
    if (sVar6 << 2 <= uVar5) break;
    uVar1 = (&__src->r)[iVar4];
    uVar2 = (&__src->r)[iVar4 + iVar3 * -4];
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (in_RDI,(long)iVar4);
    *pvVar7 = uVar1 - uVar2;
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

void prepareWriteRGB(std::vector<uint8_t> &output, const Image &image) {
	output.resize(image.colorData.size() * sizeof(Color));
	int scanline = sizeof(Color) * image.size.width;
	uint8_t *start = (uint8_t *)image.colorData.data();
	memcpy(output.data(), start, scanline);
	for (int i = scanline; i < sizeof(Color) * image.colorData.size(); i++) {
		output[i] = start[i] - start[i - scanline];
	}
}